

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O3

void __thiscall
Inferences::InductionClauseIterator::performIntInduction
          (InductionClauseIterator *this,InductionContext *context,Entry *e,bool increasing,
          Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
          bound1,TermLiteralClause *optionalBound2)

{
  uint64_t uVar1;
  void *pvVar2;
  undefined *this_00;
  Signature *pSVar3;
  Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound> CVar4;
  InferenceRule rule;
  uint fn;
  int iVar5;
  TermList TVar6;
  Formula *pFVar7;
  OperatorType *pOVar8;
  Literal *pLVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  undefined8 extraout_RAX;
  Formula *f;
  ulong uVar15;
  undefined7 in_register_00000009;
  undefined8 uVar16;
  undefined8 uVar17;
  uint64_t uVar18;
  void **head;
  void **head_11;
  TermList arg2;
  void **head_2;
  void **head_1;
  void **head_3;
  bool bVar19;
  initializer_list<Kernel::TermList> __l;
  initializer_list<Kernel::TermList> __l_00;
  initializer_list<Kernel::TermList> __l_01;
  initializer_list<Kernel::TermList> __l_02;
  ClauseStack cls;
  Substitution subst;
  allocator_type local_e9;
  Formula *local_e8;
  undefined4 local_dc;
  undefined4 *local_d8;
  undefined4 *local_d0;
  undefined8 local_c8;
  InductionContext *local_c0;
  ClauseStack local_b8;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_98;
  TermList local_70;
  FixedSizeAllocator<64UL> *local_68;
  Formula *local_60;
  Formula *local_58;
  Formula *local_50;
  Entry *local_48;
  InductionClauseIterator *local_40;
  Formula *local_38;
  
  CVar4._inner = bound1._inner;
  this_00 = Kernel::theory;
  local_c8 = CONCAT71(in_register_00000009,increasing);
  arg2._content = (uint64_t)optionalBound2;
  local_c0 = context;
  local_48 = e;
  local_40 = this;
  Kernel::IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)&local_98,(int)local_c8 - 1U | 1);
  TVar6._content =
       (uint64_t)
       Kernel::Theory::representConstant((Theory *)this_00,(IntegerConstantType *)&local_98);
  mpz_clear((__mpz_struct *)&local_98);
  local_b8._capacity._0_1_ = bound1._inner._content[0];
  local_b8._capacity._1_1_ = bound1._inner._content[1];
  local_b8._capacity._2_1_ = bound1._inner._content[2];
  local_b8._capacity._3_1_ = bound1._inner._content[3];
  local_b8._capacity._4_1_ = bound1._inner._content[4];
  local_b8._capacity._5_1_ = bound1._inner._content[5];
  local_b8._capacity._6_1_ = bound1._inner._content[6];
  local_b8._capacity._7_1_ = bound1._inner._content[7];
  __l._M_len = 1;
  __l._M_array = (iterator)&local_b8;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_98,__l,
             (allocator_type *)&local_70);
  pFVar7 = InductionContext::getFormula
                     (local_c0,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                               &local_98,true,(Substitution *)0x0);
  pvVar2 = (void *)CONCAT44(local_98._size,local_98._timestamp);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT44(local_98._nextExpansionOccupancy,local_98._capacity) -
                           (long)pvVar2);
  }
  local_b8._capacity = 1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_98,__l_00,
             (allocator_type *)&local_70);
  local_38 = InductionContext::getFormula
                       (local_c0,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                                 &local_98,true,(Substitution *)0x0);
  pvVar2 = (void *)CONCAT44(local_98._size,local_98._timestamp);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,CONCAT44(local_98._nextExpansionOccupancy,local_98._capacity) -
                           (long)pvVar2);
  }
  local_98._timestamp = 1;
  local_98._size = 0;
  local_98._deleted = 0;
  local_98._capacityIndex = 0;
  local_98._capacity = 0;
  local_98._nextExpansionOccupancy = 0;
  local_98._entries._0_4_ = 0;
  local_98._28_8_ = 0;
  local_98._afterLast._4_4_ = 0;
  local_70._content = 5;
  __l_01._M_len = 1;
  __l_01._M_array = &local_70;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_b8,__l_01,
             &local_e9);
  local_58 = InductionContext::getFormula
                       (local_c0,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                                 &local_b8,true,(Substitution *)&local_98);
  local_50 = pFVar7;
  if ((void *)local_b8._capacity != (void *)0x0) {
    operator_delete((void *)local_b8._capacity,(long)local_b8._cursor - local_b8._capacity);
  }
  pSVar3 = DAT_00b521b0;
  pOVar8 = Kernel::Theory::getNonpolymorphicOperatorType(INT_PLUS);
  fn = Kernel::Signature::getInterpretingSymbol(pSVar3,INT_PLUS,pOVar8);
  local_70._content = (uint64_t)Kernel::Term::create2(fn,(TermList)0x1,TVar6);
  __l_02._M_len = 1;
  __l_02._M_array = &local_70;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)&local_b8,__l_02,
             &local_e9);
  local_60 = InductionContext::getFormula
                       (local_c0,(vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
                                 &local_b8,true,(Substitution *)0x0);
  if ((void *)local_b8._capacity != (void *)0x0) {
    operator_delete((void *)local_b8._capacity,(long)local_b8._cursor - local_b8._capacity);
  }
  if ((performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
       ::less == '\0') &&
     (iVar5 = __cxa_guard_acquire(&performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
                                   ::less), pSVar3 = DAT_00b521b0, iVar5 != 0)) {
    pOVar8 = Kernel::Theory::getNonpolymorphicOperatorType(INT_LESS);
    performIntInduction::less = Kernel::Signature::getInterpretingSymbol(pSVar3,INT_LESS,pOVar8);
    __cxa_guard_release(&performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
                         ::less);
  }
  pFVar7 = (Formula *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60);
  local_d0 = (undefined4 *)
             Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  TVar6._content = 1;
  uVar16 = bound1._inner._content._0_8_;
  if ((InferenceRule)local_c8 != '\0') {
    uVar16._0_1_ = '\x01';
    uVar16._1_1_ = '\0';
    uVar16._2_1_ = '\0';
    uVar16._3_1_ = '\0';
    uVar16._4_1_ = '\0';
    uVar16._5_1_ = '\0';
    uVar16._6_1_ = '\0';
    uVar16._7_1_ = '\0';
    TVar6._content = bound1._inner._content._0_8_;
  }
  pLVar9 = Kernel::Literal::create2
                     ((Literal *)(ulong)performIntInduction::less,0,SUB81(uVar16,0),TVar6,arg2);
  puVar10 = local_d0;
  *local_d0 = 0;
  *(undefined4 **)(local_d0 + 2) = local_d0 + 6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_d0 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(Literal **)(puVar10 + 10) = pLVar9;
  bVar19 = true;
  if (((undefined1  [36])CVar4._inner & (undefined1  [36])0x1) == (undefined1  [36])0x0) {
    if (*(uint *)(bound1._inner._content._16_8_ + 8) == performIntInduction::less) {
      bVar19 = (*(byte *)(bound1._inner._content._16_8_ + 0x28) & 4) == 0;
    }
    else {
      bVar19 = false;
    }
  }
  local_d8 = (undefined4 *)
             Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  TVar6._content = 5;
  uVar17._0_1_ = '\x05';
  uVar17._1_1_ = '\0';
  uVar17._2_1_ = '\0';
  uVar17._3_1_ = '\0';
  uVar17._4_1_ = '\0';
  uVar17._5_1_ = '\0';
  uVar17._6_1_ = '\0';
  uVar17._7_1_ = '\0';
  uVar16 = bound1._inner._content._0_8_;
  if (bVar19 == (bool)(InferenceRule)local_c8) {
    TVar6._content = bound1._inner._content._0_8_;
    uVar16 = uVar17;
  }
  pLVar9 = Kernel::Literal::create2
                     ((Literal *)(ulong)performIntInduction::less,(uint)(bVar19 ^ 1),SUB81(uVar16,0)
                      ,TVar6,arg2);
  puVar10 = local_d8;
  *local_d8 = 0;
  *(undefined4 **)(local_d8 + 2) = local_d8 + 6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_d8 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(Literal **)(puVar10 + 10) = pLVar9;
  if ((optionalBound2 == (TermLiteralClause *)0x0) || (optionalBound2->literal == (Literal *)0x0)) {
    local_dc = 0;
  }
  else {
    local_e8 = (Formula *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60);
    uVar1 = (optionalBound2->term).super_TermList._content;
    if (bound1._inner._content._0_8_ == uVar1) goto LAB_004da3df;
    puVar10 = (undefined4 *)
              Lib::FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    TVar6._content = 1;
    uVar18 = uVar1;
    if ((InferenceRule)local_c8 != '\0') {
      uVar18 = 1;
      TVar6._content = uVar1;
    }
    pLVar9 = Kernel::Literal::create2
                       ((Literal *)(ulong)performIntInduction::less,1,SUB81(uVar18,0),TVar6,arg2);
    *puVar10 = 0;
    *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar10 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(puVar10 + 10) = pLVar9;
    if ((optionalBound2->literal->super_Term)._functor == performIntInduction::less) {
      bVar19 = ((optionalBound2->literal->super_Term)._args[0]._content & 4) == 0;
    }
    else {
      bVar19 = false;
    }
    puVar11 = (undefined4 *)
              Lib::FixedSizeAllocator<48UL>::alloc((FixedSizeAllocator<48UL> *)local_e8);
    TVar6._content = 5;
    uVar18 = uVar1;
    if (bVar19 != (bool)(InferenceRule)local_c8) {
      uVar18 = 5;
      TVar6._content = uVar1;
    }
    pLVar9 = Kernel::Literal::create2
                       ((Literal *)(ulong)performIntInduction::less,(uint)(bVar19 ^ 1),
                        SUB81(uVar18,0),TVar6,arg2);
    *puVar11 = 0;
    *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar11 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(puVar11 + 10) = pLVar9;
    puVar12 = (undefined4 *)
              Lib::FixedSizeAllocator<48UL>::alloc((FixedSizeAllocator<48UL> *)local_e8);
    puVar13 = (undefined8 *)
              Lib::FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    *puVar13 = puVar10;
    puVar13[1] = 0;
    puVar14 = (undefined8 *)
              Lib::FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    *puVar14 = local_d0;
    puVar14[1] = puVar13;
    *puVar12 = 1;
    *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar12 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(undefined8 **)(puVar12 + 10) = puVar14;
    puVar10 = (undefined4 *)
              Lib::FixedSizeAllocator<48UL>::alloc((FixedSizeAllocator<48UL> *)local_e8);
    puVar13 = (undefined8 *)
              Lib::FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    *puVar13 = puVar11;
    puVar13[1] = 0;
    puVar14 = (undefined8 *)
              Lib::FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    *puVar14 = local_d8;
    puVar14[1] = puVar13;
    *puVar10 = 1;
    *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar10 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(undefined8 **)(puVar10 + 10) = puVar14;
    local_dc = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    pFVar7 = local_e8;
    local_d8 = puVar10;
    local_d0 = puVar12;
  }
  local_e8 = (Formula *)
             Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  puVar10 = (undefined4 *)Lib::FixedSizeAllocator<48UL>::alloc((FixedSizeAllocator<48UL> *)pFVar7);
  local_68 = (FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78);
  f = (Formula *)
      Lib::FixedSizeAllocator<64UL>::alloc
                ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  puVar11 = (undefined4 *)Lib::FixedSizeAllocator<48UL>::alloc((FixedSizeAllocator<48UL> *)pFVar7);
  puVar13 = (undefined8 *)
            Lib::FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  *puVar13 = local_38;
  puVar13[1] = 0;
  puVar14 = (undefined8 *)
            Lib::FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  *puVar14 = local_d0;
  puVar14[1] = puVar13;
  *puVar11 = 1;
  *(undefined4 **)(puVar11 + 2) = puVar11 + 6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar11 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(undefined8 **)(puVar11 + 10) = puVar14;
  f->_connective = IMP;
  (f->_label)._M_dataplus._M_p = (pointer)&(f->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&f->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(undefined4 **)(f + 1) = puVar11;
  f[1]._label._M_dataplus._M_p = (pointer)local_60;
  pFVar7 = Kernel::Formula::quantify(f);
  puVar13 = (undefined8 *)
            Lib::FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  *puVar13 = pFVar7;
  puVar13[1] = 0;
  puVar14 = (undefined8 *)
            Lib::FixedSizeAllocator<16UL>::alloc
                      ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  *puVar14 = local_50;
  puVar14[1] = puVar13;
  *puVar10 = 1;
  *(undefined4 **)(puVar10 + 2) = puVar10 + 6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar10 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(undefined8 **)(puVar10 + 10) = puVar14;
  pFVar7 = (Formula *)Lib::FixedSizeAllocator<64UL>::alloc(local_68);
  pFVar7->_connective = IMP;
  (pFVar7->_label)._M_dataplus._M_p = (pointer)&(pFVar7->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pFVar7->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(undefined4 **)(pFVar7 + 1) = local_d8;
  pFVar7[1]._label._M_dataplus._M_p = (pointer)local_58;
  pFVar7 = Kernel::Formula::quantify(pFVar7);
  local_e8->_connective = IMP;
  (local_e8->_label)._M_dataplus._M_p = (pointer)&(local_e8->_label).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
             DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
  *(undefined4 **)(local_e8 + 1) = puVar10;
  local_e8[1]._label._M_dataplus._M_p = (pointer)pFVar7;
  if (((undefined1  [36])CVar4._inner & (undefined1  [36])0x1) == (undefined1  [36])0x0) {
    if ((InferenceRule)local_c8 == INPUT) {
      rule = (char)local_dc * '\x02' | INT_INF_DOWN_INDUCTION_AXIOM;
    }
    else {
      rule = (char)local_dc * '\x02' | INT_INF_UP_INDUCTION_AXIOM;
    }
  }
  else {
    rule = (InferenceRule)local_c8 ^ INT_DB_DOWN_INDUCTION_AXIOM;
  }
  produceClauses(&local_b8,local_40,local_e8,rule,local_c0,
                 (DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0);
  Indexing::InductionFormulaIndex::Entry::add(local_48,&local_b8,(Substitution *)&local_98);
  if (local_b8._stack != (Clause **)0x0) {
    uVar15 = local_b8._capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar15 == 0) {
      *local_b8._stack = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_b8._stack;
    }
    else if (uVar15 < 0x11) {
      *local_b8._stack = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_b8._stack;
    }
    else if (uVar15 < 0x19) {
      *local_b8._stack = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_b8._stack;
    }
    else if (uVar15 < 0x21) {
      *local_b8._stack = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_b8._stack;
    }
    else if (uVar15 < 0x31) {
      *local_b8._stack = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_b8._stack;
    }
    else if (uVar15 < 0x41) {
      *local_b8._stack = (Clause *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_b8._stack;
    }
    else {
      operator_delete(local_b8._stack,0x10);
    }
  }
LAB_004da3df:
  Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap(&local_98)
  ;
  return;
}

Assistant:

void InductionClauseIterator::performIntInduction(const InductionContext& context, InductionFormulaIndex::Entry* e, bool increasing, Coproduct<TermLiteralClause, DefaultBound> bound1, const TermLiteralClause* optionalBound2)
{
  TermList b1(bound1.apply([](auto x) { return x.term; }));
  TermList one(theory->representConstant(IntegerConstantType(increasing ? 1 : -1)));

  TermList x(0,false);
  TermList y(1,false);

  // create L[b1]
  Formula* Lb1 = context.getFormula({ b1 },true);

  // create L[X]
  Formula* Lx = context.getFormula({ x },true);

  // create L[Y]
  Substitution subst;
  Formula* Ly = context.getFormula({ y },true,&subst);

  // create L[X+1] or L[X-1]
  TermList fpo(Term::create2(env.signature->getInterpretingSymbol(Theory::INT_PLUS),x,one));
  Formula* Lxpo = context.getFormula({ fpo },true);

  static unsigned less = env.signature->getInterpretingSymbol(Theory::INT_LESS);
  // create X>=b1 (which is ~X<b1) or X<=b1 (which is ~b1<X)
  Formula* Lxcompb1 = new AtomicFormula(Literal::create2(less,false,(increasing ? x : b1),(increasing ? b1 : x)));
  // create Y>=b1 (which is ~Y<b1), or Y>b1, or Y<=b1 (which is ~b1<Y), or Y<b1
  // This comparison is mirroring the structure of bound1.literal, which is "b1 <comparison> inductionTerm".
  // If bound1.literal is nullptr, we are using the default bound with the comparison sign >= or <=.
  const bool isBound1Equal = bound1.match(
      [](TermLiteralClause const& bound1) { return (bound1.literal->functor() == less && bound1.literal->isNegative()); },
      [](DefaultBound) { return true; });
  const bool isBound1FirstArg = (increasing != isBound1Equal);
  Formula* Lycompb1 = new AtomicFormula(Literal::create2(
        less, !isBound1Equal, (isBound1FirstArg ? b1 : y), (isBound1FirstArg ? y : b1)));

  Formula* FxInterval;
  Formula* FyInterval;
  const bool isDefaultBound = bound1.template is<DefaultBound>();
  const bool hasBound2 = ((optionalBound2 != nullptr) && (optionalBound2->literal != nullptr));
  // Also resolve the hypothesis with comparisons with bound(s) (if the bound(s) are present/not default).
  if (hasBound2) {
    // Finite interval induction, use two bounds on both x and y.
    TermList b2(optionalBound2->term);
    if (b1 == b2) {
      return;
    }
    // create X<b2 or X>b2 (which is b2<X)
    Formula* Lxcompb2 = new AtomicFormula(Literal::create2(less, true, (increasing ? x : b2), (increasing ? b2 : x)));
    const bool isBound2Equal = (optionalBound2->literal->functor() == less && optionalBound2->literal->isNegative());
    const bool isBound2FirstArg = (increasing == isBound2Equal);
    // create Y<b2, or Y<=b2 (which is ~b2<Y) or Y>b2, or Y>=b2 (which is ~Y<b2)
    Formula* Lycompb2 = new AtomicFormula(Literal::create2(
          less, !isBound2Equal, (isBound2FirstArg ? b2 : y), (isBound2FirstArg ? y : b2)));
    FxInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lxcompb1, FormulaList::singleton(Lxcompb2)));
    FyInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lycompb1, FormulaList::singleton(Lycompb2)));
  } else {
    // Infinite interval induction (either with default bound or not), use only one bound on both x and y.
    FxInterval = Lxcompb1;
    FyInterval = Lycompb1;
  }

  // Create the hypothesis, with FxInterval and FyInterval being as described
  // in the comment above this function.
  Formula* hyp = new BinaryFormula(Connective::IMP,
                   new JunctionFormula(Connective::AND,FormulaList::cons(Lb1,FormulaList::singleton(
                     Formula::quantify(new BinaryFormula(Connective::IMP,
                       new JunctionFormula(Connective::AND, FormulaList::cons(FxInterval,FormulaList::singleton(Lx))),
                       Lxpo))))),
                   Formula::quantify(new BinaryFormula(Connective::IMP,FyInterval,Ly)));

  InferenceRule rule =
      isDefaultBound
          ? (increasing ? InferenceRule::INT_DB_UP_INDUCTION_AXIOM : InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM)
          : (increasing ? (hasBound2 ? InferenceRule::INT_FIN_UP_INDUCTION_AXIOM : InferenceRule::INT_INF_UP_INDUCTION_AXIOM)
                        : (hasBound2 ? InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM : InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM));

  auto cls = produceClauses(hyp, rule, context);
  e->add(std::move(cls), std::move(subst));
}